

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

bool __thiscall QAbstractSocketPrivate::canReadNotification(QAbstractSocketPrivate *this)

{
  SocketType SVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  
  if (this->isBuffered == true) {
    if (*(long *)&this->field_0x90 == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = *(long *)(*(long *)&this->field_0x90 + 0x18);
    }
    plVar2 = *(long **)&this->field_0x8;
    if ((this->readBufferMaxSize != 0) && (this->readBufferMaxSize <= lVar7)) {
      (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,0);
      return false;
    }
    bVar4 = readFromSocket(this);
    if (!bVar4) {
      (**(code **)(*plVar2 + 0x100))(plVar2);
      return false;
    }
    if (*(long *)&this->field_0x90 == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = *(long *)(*(long *)&this->field_0x90 + 0x18);
    }
    if (lVar6 == lVar7) {
      bVar5 = QIODevice::isReadable();
      return (bool)(bVar5 ^ 1);
    }
    goto LAB_001b2485;
  }
  SVar1 = this->socketType;
  if (this->hasPendingData == true) {
    if ((SVar1 != UdpSocket) || (this->hasPendingDatagram == true)) {
      (**(code **)(*(long *)this->socketEngine + 0x140))(this->socketEngine,0);
      return true;
    }
LAB_001b23eb:
    cVar3 = (**(code **)(*(long *)this->socketEngine + 0xe8))();
    if (cVar3 == '\0') goto LAB_001b2485;
  }
  else if (SVar1 == UdpSocket) goto LAB_001b23eb;
  this->hasPendingData = true;
  this->hasPendingDatagram = SVar1 == UdpSocket;
LAB_001b2485:
  emitReadyRead(this,0);
  return true;
}

Assistant:

bool QAbstractSocketPrivate::canReadNotification()
{
    Q_Q(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::canReadNotification()");
#endif

    // If buffered, read data from the socket into the read buffer
    if (isBuffered) {
        const qint64 oldBufferSize = buffer.size();

        // Return if there is no space in the buffer
        if (readBufferMaxSize && oldBufferSize >= readBufferMaxSize) {
            socketEngine->setReadNotificationEnabled(false);
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocketPrivate::canReadNotification() buffer is full");
#endif
            return false;
        }

        // If reading from the socket fails after getting a read
        // notification, close the socket.
        if (!readFromSocket()) {
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocketPrivate::canReadNotification() disconnecting socket");
#endif
            q->disconnectFromHost();
            return false;
        }

        // Return if there is no new data available.
        if (buffer.size() == oldBufferSize) {
            // If the socket is opened only for writing, return true
            // to indicate that the data was discarded.
            return !q->isReadable();
        }
    } else {
        const bool isUdpSocket = (socketType == QAbstractSocket::UdpSocket);
        if (hasPendingData && (!isUdpSocket || hasPendingDatagram)) {
            socketEngine->setReadNotificationEnabled(false);
            return true;
        }
        if (!isUdpSocket
#if QT_CONFIG(udpsocket)
            || socketEngine->hasPendingDatagrams()
#endif
        ) {
            hasPendingData = true;
            hasPendingDatagram = isUdpSocket;
        }
    }

    emitReadyRead();

#if defined (QABSTRACTSOCKET_DEBUG)
    // If we were closed as a result of the readyRead() signal.
    if (state == QAbstractSocket::UnconnectedState || state == QAbstractSocket::ClosingState)
        qDebug("QAbstractSocketPrivate::canReadNotification() socket is closing - returning");
#endif

    return true;
}